

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O2

bool __thiscall xercesc_4_0::CMStateSet::getBit(CMStateSet *this,XMLSize_t bitToGet)

{
  CMDynamicBuffer *pCVar1;
  XMLInt32 *pXVar2;
  ArrayIndexOutOfBoundsException *this_00;
  
  pCVar1 = this->fDynamicBuffer;
  if (this->fBitCount <= bitToGet) {
    this_00 = (ArrayIndexOutOfBoundsException *)__cxa_allocate_exception(0x30);
    if (pCVar1 == (CMDynamicBuffer *)0x0) {
      ArrayIndexOutOfBoundsException::ArrayIndexOutOfBoundsException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/CMStateSet.hpp"
                 ,0x16f,Bitset_BadIndex,(MemoryManager *)0x0);
    }
    else {
      ArrayIndexOutOfBoundsException::ArrayIndexOutOfBoundsException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/common/CMStateSet.hpp"
                 ,0x16d,Bitset_BadIndex,this->fDynamicBuffer->fMemoryManager);
    }
    __cxa_throw(this_00,&ArrayIndexOutOfBoundsException::typeinfo,
                xercesc_4_0::XMLException::~XMLException);
  }
  if (pCVar1 == (CMDynamicBuffer *)0x0) {
    pXVar2 = this->fBits + (bitToGet >> 5);
  }
  else {
    if (pCVar1->fBitArray[bitToGet >> 10] == (XMLInt32 *)0x0) {
      return false;
    }
    pXVar2 = (XMLInt32 *)
             ((long)pCVar1->fBitArray[bitToGet >> 10] + (ulong)((uint)(bitToGet >> 3) & 0x7c));
  }
  return ((uint)*pXVar2 >> ((uint)bitToGet & 0x1f) & 1) != 0 && *pXVar2 != 0;
}

Assistant:

bool getBit(const XMLSize_t bitToGet) const
    {
        if (bitToGet >= fBitCount)
        {
            if(fDynamicBuffer)
                ThrowXMLwithMemMgr(ArrayIndexOutOfBoundsException, XMLExcepts::Bitset_BadIndex, fDynamicBuffer->fMemoryManager);
            else
                ThrowXML(ArrayIndexOutOfBoundsException, XMLExcepts::Bitset_BadIndex);
        }

        // And access the right bit and byte
        if(fDynamicBuffer==0)
        {
            const XMLInt32 mask = 1UL << (bitToGet % 32);
            const XMLSize_t byteOfs = bitToGet / 32;
            return (fBits[byteOfs]!=0 && (fBits[byteOfs] & mask) != 0);
        }
        else
        {
            const XMLSize_t vectorOfs = bitToGet / CMSTATE_BITFIELD_CHUNK;
            if(fDynamicBuffer->fBitArray[vectorOfs]==NULL)
                return false;
            const XMLInt32 mask = 1UL << (bitToGet % 32);
            const XMLSize_t byteOfs = (bitToGet % CMSTATE_BITFIELD_CHUNK) / 32;
            return (fDynamicBuffer->fBitArray[vectorOfs][byteOfs]!=0 && (fDynamicBuffer->fBitArray[vectorOfs][byteOfs] & mask) != 0);
        }
    }